

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibration.cpp
# Opt level: O0

Mat * drawPerspectivePoint(Mat *img,Mat *matrix)

{
  double *pdVar1;
  Mat *in_RDX;
  Scalar_<double> local_140;
  Point_<int> local_120;
  _InputOutputArray local_118;
  double local_100;
  double new_position_y;
  double new_position_x;
  double dem;
  double num;
  int local_d8;
  int j;
  int i;
  Mat local_c8 [96];
  double local_68;
  double myMatrix [3] [3];
  Mat *matrix_local;
  Mat *img_local;
  
  cv::getPerspectiveTransform(local_c8,(Point_ *)calibrationFirstArray,0x120980);
  cv::Mat::operator=(in_RDX,local_c8);
  cv::Mat::~Mat(local_c8);
  for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
    for (num._4_4_ = 0; num._4_4_ < 3; num._4_4_ = num._4_4_ + 1) {
      pdVar1 = cv::Mat::at<double>(in_RDX,local_d8,num._4_4_);
      myMatrix[(long)local_d8 + -1][(long)num._4_4_ + 2] = *pdVar1;
    }
  }
  new_position_y =
       (local_68 * (double)toCalibrate.x + myMatrix[0][0] * (double)toCalibrate.y + myMatrix[0][1])
       / (myMatrix[1][2] * (double)toCalibrate.x + myMatrix[2][0] * (double)toCalibrate.y +
         myMatrix[2][1]);
  dem = myMatrix[0][2] * (double)toCalibrate.x + myMatrix[1][0] * (double)toCalibrate.y +
        myMatrix[1][1];
  new_position_x =
       myMatrix[1][2] * (double)toCalibrate.x + myMatrix[2][0] * (double)toCalibrate.y +
       myMatrix[2][1];
  local_100 = dem / new_position_x;
  cv::_InputOutputArray::_InputOutputArray(&local_118,matrix);
  cv::Point_<int>::Point_(&local_120,(int)new_position_y,(int)local_100);
  cv::Scalar_<double>::Scalar_(&local_140,0.0,255.0,0.0,0.0);
  cv::circle(&local_118,&local_120,0,&local_140,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_118);
  cv::Mat::Mat(img,matrix);
  return img;
}

Assistant:

Mat drawPerspectivePoint(Mat img, Mat matrix){
    double myMatrix[3][3];
    matrix = getPerspectiveTransform(calibrationFirstArray, calibrationSecondArray);
    for(int i=0; i<3; i++)
        for(int j=0; j<3; j++){
            myMatrix[i][j] = matrix.at<double>(i,j);
        }
    double num = myMatrix[0][0]*toCalibrate.x+myMatrix[0][1]*toCalibrate.y+myMatrix[0][2];
    double dem = myMatrix[2][0]*toCalibrate.x+myMatrix[2][1]*toCalibrate.y+myMatrix[2][2];
    double new_position_x = num/dem;
    num = myMatrix[1][0]*toCalibrate.x+myMatrix[1][1]*toCalibrate.y+myMatrix[1][2];
    dem = myMatrix[2][0]*toCalibrate.x+myMatrix[2][1]*toCalibrate.y+myMatrix[2][2];
    double new_position_y = num/dem;
    circle(img,Point(new_position_x,new_position_y),0,Scalar( 0, 255, 0 ),1);
    return img;
}